

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcpaddress.cpp
# Opt level: O0

RTPAddress * __thiscall
jrtplib::RTPTCPAddress::CreateCopy(RTPTCPAddress *this,RTPMemoryManager *mgr)

{
  RTPAddress *this_00;
  RTPTCPAddress *a;
  RTPMemoryManager *mgr_local;
  RTPTCPAddress *this_local;
  
  this_00 = (RTPAddress *)operator_new(0x10,mgr,0x17);
  RTPTCPAddress((RTPTCPAddress *)this_00,*(SocketType *)&(this->super_RTPAddress).field_0xc);
  return this_00;
}

Assistant:

RTPAddress *RTPTCPAddress::CreateCopy(RTPMemoryManager *mgr) const
{
	JRTPLIB_UNUSED(mgr); // possibly unused
	RTPTCPAddress *a = RTPNew(mgr,RTPMEM_TYPE_CLASS_RTPADDRESS) RTPTCPAddress(m_socket);
	return a;
}